

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void anon_unknown.dwarf_64299::AssertInt8Equals
               (uint8_t expected,char *s,ParseIntTypeCombo parse_type)

{
  ParseIntTypeCombo parse_type_local;
  char *s_local;
  uint8_t expected_local;
  
  AssertIntEquals<unsigned_char>(expected,s,wabt::ParseInt8,parse_type);
  return;
}

Assistant:

void AssertInt8Equals(uint8_t expected,
                      const char* s,
                      ParseIntTypeCombo parse_type = Both) {
  AssertIntEquals(expected, s, ParseInt8, parse_type);
}